

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall Transaction_GetRoInt_Test::TestBody(Transaction_GetRoInt_Test *this)

{
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *this_00;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
  *this_01;
  typed_address<int> elements;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_130;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_118;
  WithoutMatchers local_f1;
  Matcher<bool> local_f0;
  Matcher<bool> local_d8;
  Matcher<unsigned_long> local_b0;
  value_type local_98;
  Matcher<pstore::address> local_90;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_78;
  Transaction_GetRoInt_Test *local_10;
  Transaction_GetRoInt_Test *this_local;
  
  local_10 = this;
  local_98 = (value_type)pstore::address::null();
  testing::Matcher<pstore::address>::Matcher(&local_90,(address)local_98);
  testing::Matcher<unsigned_long>::Matcher(&local_b0,4);
  testing::Matcher<bool>::Matcher(&local_d8,true);
  testing::Matcher<bool>::Matcher(&local_f0,false);
  anon_unknown.dwarf_2883f3::mock_database::gmock_get
            (&local_78,&(this->super_Transaction).db_,&local_90,&local_b0,&local_d8,&local_f0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            operator()(&local_78,&local_f1,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                               ,0x1c6,"db_",
                               "get (pstore::address::null (), sizeof (int), true, false)");
  testing::
  Invoke<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>
            (&local_130,(testing *)&(this->super_Transaction).db_,
             (mock_database *)anon_unknown.dwarf_2883f3::mock_database::base_get,0);
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &local_118,&local_130);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(this_01,&local_118);
  testing::Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~Action
            (&local_118);
  testing::internal::
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~MockSpec
            (&local_78);
  testing::Matcher<bool>::~Matcher(&local_f0);
  testing::Matcher<bool>::~Matcher(&local_d8);
  testing::Matcher<unsigned_long>::~Matcher(&local_b0);
  testing::Matcher<pstore::address>::~Matcher(&local_90);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)(local_1a0 + 0x10),
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_180,
          &(this->super_Transaction).db_.super_database,
          (unique_lock<mock_mutex> *)(local_1a0 + 0x10));
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)(local_1a0 + 0x10));
  elements = pstore::typed_address<int>::null();
  pstore::database::getro<int,void>
            ((database *)local_1a0,(typed_address<int>)&(this->super_Transaction).db_,
             (size_t)elements.a_.a_);
  std::shared_ptr<const_int>::~shared_ptr((shared_ptr<const_int> *)local_1a0);
  pstore::transaction_base::commit((transaction_base *)local_180);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_180);
  return;
}

Assistant:

TEST_F (Transaction, GetRoInt) {
    // First setup the mock expectations.
    EXPECT_CALL (db_, get (pstore::address::null (), sizeof (int), true, false))
        .WillOnce (::testing::Invoke (&db_, &mock_database::base_get));

    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        db_.getro (pstore::typed_address<int>::null (), 1);
        transaction.commit ();
    }
}